

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * google::protobuf::compiler::js::anon_unknown_0::PostProcessFloat
                   (string *__return_storage_ptr__,string *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  string exponent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mantissa;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  iVar4 = std::__cxx11::string::compare((char *)result);
  if (iVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "Infinity";
    pcVar12 = "";
LAB_0022cc56:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar10,pcVar12);
    return __return_storage_ptr__;
  }
  iVar4 = std::__cxx11::string::compare((char *)result);
  if (iVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "-Infinity";
    pcVar12 = "";
    goto LAB_0022cc56;
  }
  iVar4 = std::__cxx11::string::compare((char *)result);
  if (iVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "NaN";
    pcVar12 = "";
    goto LAB_0022cc56;
  }
  lVar5 = std::__cxx11::string::find((char)result,0x65);
  if (lVar5 == -1) {
    lVar5 = std::__cxx11::string::find((char)result,0x2e);
    if (lVar5 == -1) {
      std::__cxx11::string::append((char *)result);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (result->_M_dataplus)._M_p;
    paVar1 = &result->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&result->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = result->_M_string_length;
    (result->_M_dataplus)._M_p = (pointer)paVar1;
    result->_M_string_length = 0;
    (result->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)result);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)result);
  lVar5 = std::__cxx11::string::find((char)&local_48,0x2e);
  if (lVar5 == -1) {
    std::__cxx11::string::append((char *)&local_48);
  }
  pcVar12 = "";
  if (local_a0 != 0) {
    if ((char)*local_a8 == '+') {
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
    }
    else if ((local_a0 != 0) && ((char)*local_a8 == '-')) {
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      pcVar12 = "-";
    }
  }
  if (1 < local_a0) {
    do {
      if ((char)*local_a8 != '0') break;
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
    } while (1 < local_a0);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)&local_88);
  local_68 = local_58;
  sVar6 = strlen(pcVar12);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar12,pcVar12 + sVar6);
  uVar11 = 0xf;
  if (local_88 != local_78) {
    uVar11 = local_78[0];
  }
  if (uVar11 < (ulong)(local_60 + local_80)) {
    uVar11 = 0xf;
    if (local_68 != local_58) {
      uVar11 = local_58[0];
    }
    if ((ulong)(local_60 + local_80) <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_0022ce2a;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_0022ce2a:
  local_c8 = &local_b8;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_b8 = *plVar8;
    uStack_b0 = puVar7[3];
  }
  else {
    local_b8 = *plVar8;
    local_c8 = (long *)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar9) {
    lVar5 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_48 == local_38) {
    return __return_storage_ptr__;
  }
  operator_delete(local_48,local_38[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

string PostProcessFloat(string result) {
  // If inf, -inf or nan, replace with +Infinity, -Infinity or NaN.
  if (result == "inf") {
    return "Infinity";
  } else if (result == "-inf") {
    return "-Infinity";
  } else if (result == "nan") {
    return "NaN";
  }

  // If scientific notation (e.g., "1e10"), (i) capitalize the "e", (ii)
  // ensure that the mantissa (portion prior to the "e") has at least one
  // fractional digit (after the decimal point), and (iii) strip any unnecessary
  // leading zeroes and/or '+' signs from the exponent.
  string::size_type exp_pos = result.find('e');
  if (exp_pos != string::npos) {
    string mantissa = result.substr(0, exp_pos);
    string exponent = result.substr(exp_pos + 1);

    // Add ".0" to mantissa if no fractional part exists.
    if (mantissa.find('.') == string::npos) {
      mantissa += ".0";
    }

    // Strip the sign off the exponent and store as |exp_neg|.
    bool exp_neg = false;
    if (!exponent.empty() && exponent[0] == '+') {
      exponent = exponent.substr(1);
    } else if (!exponent.empty() && exponent[0] == '-') {
      exp_neg = true;
      exponent = exponent.substr(1);
    }

    // Strip any leading zeroes off the exponent.
    while (exponent.size() > 1 && exponent[0] == '0') {
      exponent = exponent.substr(1);
    }

    return mantissa + "E" + string(exp_neg ? "-" : "") + exponent;
  }

  // Otherwise, this is an ordinary decimal number. Append ".0" if result has no
  // decimal/fractional part in order to match output of original codegen.
  if (result.find('.') == string::npos) {
    result += ".0";
  }

  return result;
}